

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmath.hpp
# Opt level: O0

int (anonymous_namespace)::inBetween<int,int,int>(int min,int x,int max)

{
  int max_local;
  int x_local;
  int min_local;
  int local_4;
  
  local_4 = min;
  if ((min <= x) && (local_4 = x, max < x)) {
    local_4 = max;
  }
  return local_4;
}

Assistant:

inline B inBetween(A min, B x, C max)
{
  using T = typename std::common_type<A, B, C>::type;

  if ((T) x < (T) min)
    return (B) min;
  if ((T) x > (T) max)
    return (B) max;

  return x;
}